

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O1

int Dau_DsdToGia_rec(Gia_Man_t *pGia,char *pStr,char **p,int *pMatches,int *pLits,Vec_Int_t *vCover)

{
  Gia_Obj_t *pGVar1;
  char cVar2;
  char cVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *pVVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  int iVar10;
  uint uVar11;
  int Fill;
  uint uVar12;
  Gia_Obj_t *pGVar13;
  long lVar14;
  char *pcVar15;
  uint uVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  bool bVar21;
  int Temp [3];
  Vec_Int_t vLeaves;
  int pFans [12];
  int local_278 [12];
  Vec_Int_t local_248;
  word local_238 [65];
  
  cVar2 = **p;
  if (cVar2 == '!') {
    *p = *p + 1;
  }
  pcVar17 = *p;
  cVar3 = *pcVar17;
  if ((byte)(cVar3 + 0x9fU) < 0xc) {
    uVar6 = pLits[(int)cVar3 - 0x61];
joined_r0x004a06da:
    if ((int)uVar6 < 0) goto LAB_004a0933;
LAB_004a010a:
    uVar6 = uVar6 ^ cVar2 == '!';
  }
  else {
    if (cVar3 == '[') {
      if (pStr[pMatches[(long)pcVar17 - (long)pStr]] != ']') {
        __assert_fail("**p == \'[\' && *q == \']\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x123,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pcVar15 = pStr + pMatches[(long)pcVar17 - (long)pStr];
      *p = pcVar17 + 1;
      iVar20 = 0;
      if (pcVar17 + 1 < pcVar15) {
        iVar10 = 0;
        do {
          iVar7 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
          iVar20 = iVar10 + 1;
          Dau_DsdAddToArray(pGia,(int *)local_238,iVar10,iVar7);
          pcVar17 = *p;
          *p = pcVar17 + 1;
          iVar10 = iVar20;
        } while (pcVar17 + 1 < pcVar15);
      }
      uVar6 = Dau_DsdBalance(pGia,(int *)local_238,iVar20,0);
      if (*p != pcVar15) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x12a,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
    }
    else {
      if (cVar3 == '<') {
        lVar14 = (long)pMatches[(long)pcVar17 - (long)pStr];
        iVar20 = 0;
        if (pStr[lVar14 + 1] == '{') {
          pcVar15 = pStr + lVar14 + 1;
          *p = pcVar15;
          if ((*pcVar15 != '{') ||
             (pcVar15 = pStr + pMatches[(long)pcVar15 - (long)pStr], *pcVar15 != '}')) {
            __assert_fail("**p == \'{\' && *q2 == \'}\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                          ,0x13b,
                          "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                         );
          }
          pcVar9 = pStr + lVar14 + 2;
          *p = pcVar9;
          lVar14 = 0;
          if (pcVar9 < pcVar15) {
            lVar14 = 0;
            do {
              iVar20 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
              *(int *)((long)local_238 + lVar14 * 4) = iVar20;
              pcVar9 = *p + 1;
              *p = pcVar9;
              lVar14 = lVar14 + 1;
            } while (pcVar9 < pcVar15);
          }
          iVar20 = (int)lVar14;
          if (pcVar9 != pcVar15) {
            __assert_fail("*p == q2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                          ,0x13e,
                          "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                         );
          }
          pLits = (int *)local_238;
        }
        *p = pcVar17;
        if ((*pcVar17 != '<') ||
           (pcVar15 = pStr + pMatches[(long)pcVar17 - (long)pStr], *pcVar15 != '>')) {
          __assert_fail("**p == \'<\' && *q == \'>\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                        ,0x146,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        if (iVar20 != 0) {
          for (; pcVar17 < pcVar15; pcVar17 = pcVar17 + 1) {
            if (((byte)(*pcVar17 + 0x9fU) < 0x1a) && (iVar20 <= *pcVar17 + -0x61)) {
              __assert_fail("*pOld - \'a\' < nVars",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                            ,0x14b,
                            "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                           );
            }
          }
        }
        pcVar9 = *p;
        pcVar17 = pcVar9 + 1;
        *p = pcVar17;
        if (pcVar17 < pcVar15) {
          lVar14 = 0;
          do {
            iVar20 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
            *(int *)((long)local_278 + lVar14) = iVar20;
            lVar14 = lVar14 + 4;
            pcVar9 = *p;
            pcVar17 = pcVar9 + 1;
            *p = pcVar17;
          } while (pcVar17 < pcVar15);
          bVar21 = lVar14 == 0xc;
        }
        else {
          bVar21 = false;
        }
        if (!bVar21) {
          __assert_fail("pTemp == Temp + 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                        ,0x14f,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        if (pcVar17 != pcVar15) {
          __assert_fail("*p == q",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                        ,0x150,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        if (pcVar15[1] == '{') {
          *p = pcVar9 + 2;
          if ((pcVar9[2] != '{') || (pStr[pMatches[(long)(pcVar9 + 2) - (long)pStr]] != '}')) {
            __assert_fail("**p == \'{\' && *q == \'}\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                          ,0x154,
                          "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                         );
          }
          *p = pStr + pMatches[(long)(pcVar9 + 2) - (long)pStr];
        }
        if (pGia->pMuxes == (uint *)0x0) {
          uVar6 = Gia_ManHashMux(pGia,local_278[0],local_278[1],local_278[2]);
        }
        else {
          uVar6 = Gia_ManHashMuxReal(pGia,local_278[0],local_278[1],local_278[2]);
        }
        if ((int)uVar6 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        uVar12 = uVar6 >> 1;
        if (pGia->nObjs <= (int)uVar12) {
LAB_004a0898:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar18 = *(ulong *)(pGia->pObjs + uVar12);
        uVar19 = uVar18 & 0x1fffffff;
        if (uVar19 != 0x1fffffff && -1 < (int)uVar18) {
          pGVar1 = pGia->pObjs + uVar12;
          if (pGia->pMuxes == (uint *)0x0) {
            if ((~*(uint *)(pGVar1 + -uVar19) & 0x1fffffff) != 0 &&
                -1 < (int)*(uint *)(pGVar1 + -uVar19)) {
              Gia_ObjSetAndLevel(pGia,pGVar1 + -uVar19);
            }
            uVar18 = (ulong)(*(uint *)&pGVar1->field_0x4 & 0x1fffffff);
            if ((~*(uint *)(pGVar1 + -uVar18) & 0x1fffffff) != 0 &&
                -1 < (int)*(uint *)(pGVar1 + -uVar18)) {
              Gia_ObjSetAndLevel(pGia,pGVar1 + -uVar18);
            }
            Gia_ObjSetAndLevel(pGia,pGVar1);
          }
          else {
            Gia_ObjSetMuxLevel(pGia,pGVar1);
          }
        }
        goto LAB_004a010a;
      }
      if (cVar3 != '(') {
        if (5 < (byte)(cVar3 + 0xbfU) && 9 < (byte)(cVar3 - 0x30U)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                        ,0x184,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        iVar20 = Abc_TtReadHex(local_238,pcVar17);
        iVar10 = 1 << ((char)iVar20 - 2U & 0x1f);
        if (iVar20 < 3) {
          iVar10 = 1;
        }
        pcVar15 = *p;
        pcVar17 = pcVar15 + iVar10;
        *p = pcVar17;
        if ((pcVar15[iVar10] != '{') ||
           (pcVar15 = pStr + pMatches[(long)pcVar17 - (long)pStr], *pcVar15 != '}')) {
          __assert_fail("**p == \'{\' && *q == \'}\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                        ,0x173,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        pcVar17 = pcVar17 + 1;
        *p = pcVar17;
        lVar14 = 0;
        if (pcVar17 < pcVar15) {
          lVar14 = 0;
          do {
            iVar10 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
            local_278[lVar14] = iVar10;
            pcVar17 = *p + 1;
            *p = pcVar17;
            lVar14 = lVar14 + 1;
          } while (pcVar17 < pcVar15);
        }
        if ((int)lVar14 != iVar20) {
          __assert_fail("i == nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                        ,0x176,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        if (pcVar17 != pcVar15) {
          __assert_fail("*p == q",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                        ,0x177,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        local_248.pArray = local_278;
        uVar12 = pGia->nObjs;
        uVar18 = (ulong)uVar12;
        local_248.nCap = iVar20;
        local_248.nSize = iVar20;
        uVar6 = Kit_TruthToGia(pGia,(uint *)local_238,iVar20,vCover,&local_248,1);
        iVar20 = pGia->nObjs;
        if ((int)uVar12 < iVar20) {
          lVar14 = uVar18 * 0xc;
          do {
            if ((int)uVar12 < 0) goto LAB_004a0898;
            pGVar4 = pGia->pObjs;
            pGVar1 = (Gia_Obj_t *)(&pGVar4->field_0x0 + lVar14);
            uVar19 = *(ulong *)(&pGVar4->field_0x0 + lVar14);
            uVar8 = (uint)uVar19;
            uVar11 = uVar8 & 0x1fffffff;
            uVar16 = (uint)(uVar19 >> 0x20) & 0x1fffffff;
            if ((((int)uVar8 < 0) || (uVar11 == 0x1fffffff)) || (uVar11 != uVar16)) {
              if (iVar20 <= (int)uVar18) goto LAB_004a0879;
              if ((pGia->pMuxes == (uint *)0x0) || (pGia->pMuxes[uVar18] == 0)) {
                if (((int)uVar8 < 0) || (((uVar8 & 0x1fffffff) == 0x1fffffff || (uVar16 <= uVar11)))
                   ) {
                  if ((uVar8 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar8) {
                    Gia_ObjSetAndLevel(pGia,pGVar1);
                  }
                }
                else {
                  Gia_ObjSetXorLevel(pGia,pGVar1);
                }
              }
              else {
                Gia_ObjSetMuxLevel(pGia,pGVar1);
              }
            }
            else {
              if ((uVar19 & 0x1fffffff) == 0x1fffffff) {
                __assert_fail("Gia_ObjIsAnd(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                              ,0x20d,"void Gia_ObjSetBufLevel(Gia_Man_t *, Gia_Obj_t *)");
              }
              iVar10 = (int)(uVar19 & 0x1fffffff);
              pGVar13 = (Gia_Obj_t *)(lVar14 + (ulong)(uint)(iVar10 * 4) * -3 + (long)pGVar4);
              if ((pGVar13 < pGVar4) || (pGVar4 + iVar20 <= pGVar13)) {
LAB_004a0879:
                __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                              ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
              }
              uVar8 = (int)((long)(lVar14 + (ulong)(uint)(iVar10 << 2) * -3) >> 2) * -0x55555555;
              pVVar5 = pGia->vLevels;
              Vec_IntFillExtra(pVVar5,uVar8 + 1,(int)pGVar13);
              if (((int)uVar8 < 0) || (pVVar5->nSize <= (int)uVar8)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              pGVar13 = pGia->pObjs;
              if ((pGVar1 < pGVar13) || (pGVar13 + pGia->nObjs <= pGVar1)) goto LAB_004a0879;
              iVar20 = pVVar5->pArray[uVar8 & 0x7fffffff];
              uVar8 = (int)((long)pGVar4 + (lVar14 - (long)pGVar13) >> 2) * -0x55555555;
              pVVar5 = pGia->vLevels;
              Vec_IntFillExtra(pVVar5,uVar8 + 1,Fill);
              if (((int)uVar8 < 0) || (pVVar5->nSize <= (int)uVar8)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              pVVar5->pArray[uVar8 & 0x7fffffff] = iVar20;
            }
            uVar18 = uVar18 + 1;
            iVar20 = pGia->nObjs;
            lVar14 = lVar14 + 0xc;
          } while ((int)uVar18 < iVar20);
        }
        m_Non1Step = m_Non1Step + 1;
        goto joined_r0x004a06da;
      }
      if (pStr[pMatches[(long)pcVar17 - (long)pStr]] != ')') {
        __assert_fail("**p == \'(\' && *q == \')\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x115,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pcVar15 = pStr + pMatches[(long)pcVar17 - (long)pStr];
      *p = pcVar17 + 1;
      iVar20 = 0;
      if (pcVar17 + 1 < pcVar15) {
        iVar10 = 0;
        do {
          iVar7 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
          iVar20 = iVar10 + 1;
          Dau_DsdAddToArray(pGia,(int *)local_238,iVar10,iVar7);
          pcVar17 = *p;
          *p = pcVar17 + 1;
          iVar10 = iVar20;
        } while (pcVar17 + 1 < pcVar15);
      }
      uVar6 = Dau_DsdBalance(pGia,(int *)local_238,iVar20,1);
      if (*p != pcVar15) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauGia.c"
                      ,0x11c,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
    }
    if ((int)uVar6 < 0) {
LAB_004a0933:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10f,"int Abc_LitNotCond(int, int)");
    }
    uVar6 = uVar6 ^ cVar2 == '!';
  }
  return uVar6;
}

Assistant:

int Dau_DsdToGia_rec( Gia_Man_t * pGia, char * pStr, char ** p, int * pMatches, int * pLits, Vec_Int_t * vCover )
{
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p < 'a' + DAU_DSD_MAX_VAR ) // var
        return Abc_LitNotCond( pLits[**p - 'a'], fCompl );
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int pFans[DAU_DSD_MAX_VAR], nFans = 0, Fan;
        assert( **p == '(' && *q == ')' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Fan = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            Dau_DsdAddToArray( pGia, pFans, nFans++, Fan );
        }
        Fan = Dau_DsdBalance( pGia, pFans, nFans, 1 );
        assert( *p == q );
        return Abc_LitNotCond( Fan, fCompl );
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int pFans[DAU_DSD_MAX_VAR], nFans = 0, Fan;
        assert( **p == '[' && *q == ']' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Fan = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            Dau_DsdAddToArray( pGia, pFans, nFans++, Fan );
        }
        Fan = Dau_DsdBalance( pGia, pFans, nFans, 0 );
        assert( *p == q );
        return Abc_LitNotCond( Fan, fCompl );
    }
    if ( **p == '<' ) // mux
    {
        Gia_Obj_t * pObj;
        int nVars = 0;
        int Temp[3], * pTemp = Temp, Res;
        int Fanins[DAU_DSD_MAX_VAR], * pLits2;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        // read fanins
        if ( *(q+1) == '{' )
        {
            char * q2;
            *p = q+1;
            q2 = pStr + pMatches[ *p - pStr ];
            assert( **p == '{' && *q2 == '}' );
            for ( nVars = 0, (*p)++; *p < q2; (*p)++, nVars++ )
                Fanins[nVars] = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            assert( *p == q2 );
            pLits2 = Fanins;
        }
        else
            pLits2 = pLits;
        // read MUX
        *p = pOld;
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '<' && *q == '>' );
        // verify internal variables
        if ( nVars )
            for ( ; pOld < q; pOld++ )
                if ( *pOld >= 'a' && *pOld <= 'z' )
                    assert( *pOld - 'a' < nVars );
        // derive MUX components
        for ( (*p)++; *p < q; (*p)++ )
            *pTemp++ = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits2, vCover );
        assert( pTemp == Temp + 3 );
        assert( *p == q );
        if ( *(q+1) == '{' ) // and/or
        {
            char * q = pStr + pMatches[ ++(*p) - pStr ];
            assert( **p == '{' && *q == '}' );
            *p = q;
        }
        if ( pGia->pMuxes )
            Res = Gia_ManHashMuxReal( pGia, Temp[0], Temp[1], Temp[2] );
        else
            Res = Gia_ManHashMux( pGia, Temp[0], Temp[1], Temp[2] );
        pObj = Gia_ManObj(pGia, Abc_Lit2Var(Res));
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( pGia->pMuxes )
                Gia_ObjSetMuxLevel( pGia, pObj );
            else 
            {
                if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
                    Gia_ObjSetAndLevel( pGia, Gia_ObjFanin0(pObj) );
                if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
                    Gia_ObjSetAndLevel( pGia, Gia_ObjFanin1(pObj) );
                Gia_ObjSetAndLevel( pGia, pObj );
            }
        }
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        Vec_Int_t vLeaves;  char * q;
        word pFunc[DAU_DSD_MAX_VAR > 6 ? (1 << (DAU_DSD_MAX_VAR-6)) : 1];
        int Fanins[DAU_DSD_MAX_VAR], Res, nObjOld; 
        int i, nVars = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVars );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Fanins[i] = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
        assert( i == nVars );
        assert( *p == q );
        vLeaves.nCap = nVars;
        vLeaves.nSize = nVars;
        vLeaves.pArray = Fanins;      
        nObjOld = Gia_ManObjNum(pGia);
        Res = Kit_TruthToGia( pGia, (unsigned *)pFunc, nVars, vCover, &vLeaves, 1 );
//        assert( nVars <= 6 );
//        Res = Dau_DsdToGiaCompose_rec( pGia, pFunc[0], Fanins, nVars );
        for ( i = nObjOld; i < Gia_ManObjNum(pGia); i++ )
            Gia_ObjSetGateLevel( pGia, Gia_ManObj(pGia, i) );
        m_Non1Step++;
        return Abc_LitNotCond( Res, fCompl );
    }
    assert( 0 );
    return 0;
}